

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecialFormat.cpp
# Opt level: O3

bool IsSystem24Track(Track *track)

{
  Sector *pSVar1;
  bool bVar2;
  int iVar3;
  Sector *s;
  Sector *this;
  uint8_t *puVar4;
  
  iVar3 = Track::size(track);
  if (iVar3 == 7) {
    this = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    pSVar1 = (track->m_sectors).super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this != pSVar1) {
      puVar4 = "\x04\x04\x04\x04\x04\x03\x01";
      do {
        if (this->datarate != _500K) {
          return false;
        }
        if (this->encoding != MFM) {
          return false;
        }
        if (((this->header).size != (uint)*puVar4) || (bVar2 = Sector::has_data(this), !bVar2))
        goto LAB_0016caef;
        this = this + 1;
        puVar4 = puVar4 + 1;
      } while (this != pSVar1);
    }
    bVar2 = true;
    if (opt.debug != 0) {
      util::operator<<((LogHelper *)&util::cout,(char (*) [26])"detected System-24 track\n");
    }
  }
  else {
LAB_0016caef:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsSystem24Track(const Track& track)
{
    static const uint8_t sizes[] = { 4,4,4,4,4,3,1 };
    auto i = 0;

    if (track.size() != arraysize(sizes))
        return false;

    for (auto& s : track)
    {
        if (s.datarate != DataRate::_500K || s.encoding != Encoding::MFM ||
            s.header.size != sizes[i++] || !s.has_data())
            return false;
    }

    if (opt.debug) util::cout << "detected System-24 track\n";
    return true;
}